

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_udunits.cpp
# Opt level: O0

void __thiscall UDUNITS_derivedAlias_Test::TestBody(UDUNITS_derivedAlias_Test *this)

{
  bool bVar1;
  Message *pMVar2;
  char *pcVar3;
  XMLElement *pXVar4;
  XMLNode *pXVar5;
  uint64_t uVar6;
  XMLElement *this_00;
  ostream *poVar7;
  char *in_R9;
  double dVar8;
  precise_unit pVar9;
  AssertHelper local_4d0;
  Message local_4c8;
  int local_4bc;
  undefined1 local_4b8 [8];
  AssertionResult gtest_ar;
  unit local_49c;
  allocator local_491;
  string local_490;
  undefined1 local_470 [8];
  precise_unit symUnit;
  char *symString;
  XMLElement *sym;
  unit local_444;
  allocator local_439;
  string local_438;
  undefined1 local_418 [8];
  precise_unit nameUnit;
  char *sname;
  XMLElement *name;
  XMLElement *alias;
  undefined1 local_3d0 [8];
  precise_unit definitionUnit;
  string local_3b8 [8];
  string def;
  XMLElement *defEl;
  XMLElement *pXStack_388;
  int failConvert;
  XMLElement *cs;
  string local_378;
  AssertHelper local_358;
  Message local_350;
  bool local_341;
  undefined1 local_340 [8];
  AssertionResult gtest_ar_;
  XMLError local_31c;
  undefined1 local_318 [4];
  XMLError err;
  XMLDocument doc;
  UDUNITS_derivedAlias_Test *this_local;
  
  doc._commentPool._120_8_ = this;
  tinyxml2::XMLDocument::XMLDocument((XMLDocument *)local_318,true,PRESERVE_WHITESPACE);
  local_31c = tinyxml2::XMLDocument::LoadFile
                        ((XMLDocument *)local_318,
                         "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/files/UDUNITS2/udunits2-derived.xml"
                        );
  local_341 = local_31c == XML_SUCCESS;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_340,&local_341,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_340);
  if (!bVar1) {
    testing::Message::Message(&local_350);
    pMVar2 = testing::Message::operator<<(&local_350,&local_31c);
    pMVar2 = testing::Message::operator<<(pMVar2,std::endl<char,std::char_traits<char>>);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_378,(internal *)local_340,(AssertionResult *)0x1d3e4c,"true","false",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_358,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_udunits.cpp"
               ,0xcb,pcVar3);
    testing::internal::AssertHelper::operator=(&local_358,pMVar2);
    testing::internal::AssertHelper::~AssertHelper(&local_358);
    std::__cxx11::string::~string((string *)&local_378);
    testing::Message::~Message(&local_350);
  }
  cs._4_4_ = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_340);
  if (cs._4_4_ == 0) {
    pXVar4 = tinyxml2::XMLNode::FirstChildElement((XMLNode *)local_318,"unit-system");
    pXStack_388 = tinyxml2::XMLNode::FirstChildElement(&pXVar4->super_XMLNode,"unit");
    defEl._4_4_ = 0;
    while (pXStack_388 != (XMLElement *)0x0) {
      def.field_2._8_8_ = tinyxml2::XMLNode::FirstChildElement(&pXStack_388->super_XMLNode,"def");
      definitionUnit.commodity_._2_1_ = 0;
      definitionUnit.commodity_._0_1_ = 0;
      if ((XMLElement *)def.field_2._8_8_ == (XMLElement *)0x0) {
        std::allocator<char>::allocator();
        definitionUnit.commodity_._0_1_ = 1;
        std::__cxx11::string::string
                  (local_3b8,"rad",(allocator *)((long)&definitionUnit.commodity_ + 1));
      }
      else {
        pXVar5 = tinyxml2::XMLNode::FirstChild((XMLNode *)def.field_2._8_8_);
        pcVar3 = tinyxml2::XMLNode::Value(pXVar5);
        std::allocator<char>::allocator();
        definitionUnit.commodity_._2_1_ = 1;
        std::__cxx11::string::string
                  (local_3b8,pcVar3,(allocator *)((long)&definitionUnit.commodity_ + 3));
      }
      if (((byte)definitionUnit.commodity_ & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)((long)&definitionUnit.commodity_ + 1));
      }
      if ((definitionUnit.commodity_._2_1_ & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)((long)&definitionUnit.commodity_ + 3));
      }
      std::__cxx11::string::string((string *)&alias,local_3b8);
      uVar6 = units::getDefaultFlags();
      pVar9 = units::unit_from_string((string *)&alias,uVar6);
      definitionUnit.multiplier_ = pVar9._8_8_;
      local_3d0 = (undefined1  [8])pVar9.multiplier_;
      std::__cxx11::string::~string((string *)&alias);
      pXVar4 = tinyxml2::XMLNode::FirstChildElement(&pXStack_388->super_XMLNode,"aliases");
      if (pXVar4 == (XMLElement *)0x0) {
        pXStack_388 = tinyxml2::XMLNode::NextSiblingElement(&pXStack_388->super_XMLNode,"unit");
        cs._4_4_ = 2;
      }
      else {
        for (sname = (char *)tinyxml2::XMLNode::FirstChildElement(&pXVar4->super_XMLNode,"name");
            sname != (char *)0x0;
            sname = (char *)tinyxml2::XMLNode::NextSiblingElement((XMLNode *)sname,"name")) {
          this_00 = tinyxml2::XMLNode::FirstChildElement((XMLNode *)sname,"singular");
          pXVar5 = tinyxml2::XMLNode::FirstChild(&this_00->super_XMLNode);
          pcVar3 = tinyxml2::XMLNode::Value(pXVar5);
          nameUnit._8_8_ = pcVar3;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_438,pcVar3,&local_439);
          uVar6 = units::getDefaultFlags();
          pVar9 = units::unit_from_string(&local_438,uVar6);
          nameUnit.multiplier_ = pVar9._8_8_;
          local_418 = (undefined1  [8])pVar9.multiplier_;
          std::__cxx11::string::~string((string *)&local_438);
          std::allocator<char>::~allocator((allocator<char> *)&local_439);
          bVar1 = units::is_error((precise_unit *)local_418);
          if (bVar1) {
            poVar7 = std::operator<<((ostream *)&std::cout,"unable to convert ");
            poVar7 = std::operator<<(poVar7,(char *)nameUnit._8_8_);
            poVar7 = std::operator<<(poVar7," into a valid unit def=");
            poVar7 = std::operator<<(poVar7,local_3b8);
            std::operator<<(poVar7,'\n');
            defEl._4_4_ = defEl._4_4_ + 1;
          }
          else {
            local_444 = units::unit_cast((precise_unit *)local_418);
            register0x00000000 = units::unit_cast((precise_unit *)local_3d0);
            dVar8 = units::convert<units::unit,units::unit>(&local_444,(unit *)((long)&sym + 4));
            if ((dVar8 != 1.0) || (NAN(dVar8))) {
              poVar7 = std::operator<<((ostream *)&std::cout,"name and unit do not match ");
              poVar7 = std::operator<<(poVar7,(char *)nameUnit._8_8_);
              poVar7 = std::operator<<(poVar7," and ");
              poVar7 = std::operator<<(poVar7,local_3b8);
              std::operator<<(poVar7,"\n");
              defEl._4_4_ = defEl._4_4_ + 1;
            }
          }
        }
        for (symString = (char *)tinyxml2::XMLNode::FirstChildElement
                                           (&pXVar4->super_XMLNode,"symbol");
            symString != (char *)0x0;
            symString = (char *)tinyxml2::XMLNode::NextSiblingElement((XMLNode *)symString,"symbol")
            ) {
          pXVar5 = tinyxml2::XMLNode::FirstChild((XMLNode *)symString);
          pcVar3 = tinyxml2::XMLNode::Value(pXVar5);
          symUnit._8_8_ = pcVar3;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_490,pcVar3,&local_491);
          uVar6 = units::getDefaultFlags();
          pVar9 = units::unit_from_string(&local_490,uVar6);
          symUnit.multiplier_ = pVar9._8_8_;
          local_470 = (undefined1  [8])pVar9.multiplier_;
          std::__cxx11::string::~string((string *)&local_490);
          std::allocator<char>::~allocator((allocator<char> *)&local_491);
          bVar1 = units::is_error((precise_unit *)local_470);
          if (bVar1) {
            poVar7 = std::operator<<((ostream *)&std::cout,"unable to convert ");
            poVar7 = std::operator<<(poVar7,(char *)symUnit._8_8_);
            poVar7 = std::operator<<(poVar7," into a valid unit def=");
            poVar7 = std::operator<<(poVar7,local_3b8);
            std::operator<<(poVar7,'\n');
            defEl._4_4_ = defEl._4_4_ + 1;
          }
          else {
            local_49c = units::unit_cast((precise_unit *)local_470);
            register0x00000000 = units::unit_cast((precise_unit *)local_3d0);
            dVar8 = units::convert<units::unit,units::unit>
                              (&local_49c,
                               (unit *)((long)&gtest_ar.message_._M_t.
                                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               .
                                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       + 4));
            if ((dVar8 != 1.0) || (NAN(dVar8))) {
              poVar7 = std::operator<<((ostream *)&std::cout,"name and unit do not match ");
              poVar7 = std::operator<<(poVar7,(char *)symUnit._8_8_);
              poVar7 = std::operator<<(poVar7," and ");
              poVar7 = std::operator<<(poVar7,local_3b8);
              std::operator<<(poVar7,"\n");
              defEl._4_4_ = defEl._4_4_ + 1;
            }
          }
        }
        pXStack_388 = tinyxml2::XMLNode::NextSiblingElement(&pXStack_388->super_XMLNode,"unit");
        cs._4_4_ = 0;
      }
      std::__cxx11::string::~string(local_3b8);
    }
    local_4bc = 0;
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_4b8,"failConvert","0",(int *)((long)&defEl + 4),&local_4bc);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4b8);
    if (!bVar1) {
      testing::Message::Message(&local_4c8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_4b8);
      testing::internal::AssertHelper::AssertHelper
                (&local_4d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_udunits.cpp"
                 ,0x105,pcVar3);
      testing::internal::AssertHelper::operator=(&local_4d0,&local_4c8);
      testing::internal::AssertHelper::~AssertHelper(&local_4d0);
      testing::Message::~Message(&local_4c8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_4b8);
    cs._4_4_ = 0;
  }
  tinyxml2::XMLDocument::~XMLDocument((XMLDocument *)local_318);
  return;
}

Assistant:

TEST(UDUNITS, derivedAlias)
{
    tinyxml2::XMLDocument doc;
    auto err = doc.LoadFile(TEST_FILE_FOLDER "/UDUNITS2/udunits2-derived.xml");
    ASSERT_FALSE(err) << err << std::endl;
    auto cs = doc.FirstChildElement("unit-system")->FirstChildElement("unit");
    int failConvert = 0;
    while (cs != nullptr) {
        auto defEl = cs->FirstChildElement("def");
        // the only one without a definition is the radian since it is
        // dimensionless according to the xml
        std::string def =
            (defEl) ? defEl->FirstChild()->Value() : std::string("rad");

        auto definitionUnit = units::unit_from_string(def);

        auto alias = cs->FirstChildElement("aliases");
        if (alias == nullptr) {
            cs = cs->NextSiblingElement("unit");
            continue;
        }
        auto name = alias->FirstChildElement("name");
        while (name != nullptr) {
            auto sname =
                name->FirstChildElement("singular")->FirstChild()->Value();
            auto nameUnit = units::unit_from_string(sname);
            if (is_error(nameUnit)) {
                std::cout << "unable to convert " << sname
                          << " into a valid unit def=" << def << '\n';
                ++failConvert;
            } else {
                if (convert(unit_cast(nameUnit), unit_cast(definitionUnit)) !=
                    1.0) {
                    std::cout << "name and unit do not match " << sname
                              << " and " << def << "\n";
                    ++failConvert;
                }
            }
            name = name->NextSiblingElement("name");
        }
        // check for symbols
        auto sym = alias->FirstChildElement("symbol");
        while (sym != nullptr) {
            auto symString = sym->FirstChild()->Value();
            auto symUnit = units::unit_from_string(symString);
            if (is_error(symUnit)) {
                std::cout << "unable to convert " << symString
                          << " into a valid unit def=" << def << '\n';
                ++failConvert;
            } else {
                if (convert(unit_cast(symUnit), unit_cast(definitionUnit)) !=
                    1.0) {
                    std::cout << "name and unit do not match " << symString
                              << " and " << def << "\n";
                    ++failConvert;
                }
            }
            sym = sym->NextSiblingElement("symbol");
        }

        cs = cs->NextSiblingElement("unit");
    }
    EXPECT_EQ(failConvert, 0);
}